

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O0

value function_metadata_name(function_conflict func)

{
  value *str;
  value pvVar1;
  size_t *in_RDI;
  value *name_array;
  value name;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  size_t length;
  value *in_stack_ffffffffffffffe0;
  value local_8;
  
  local_8 = value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    str = value_to_array((value)0x12372c);
    pvVar1 = value_create_string((char *)str,in_stack_ffffffffffffffd8);
    *str = pvVar1;
    if (*str == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (value)0x0;
    }
    else {
      length = *in_RDI;
      strlen((char *)*in_RDI);
      pvVar1 = value_create_string((char *)str,length);
      str[1] = pvVar1;
      if (str[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (value)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value function_metadata_name(function func)
{
	static const char func_str[] = "name";

	value name = value_create_array(NULL, 2);

	value *name_array;

	if (name == NULL)
	{
		return NULL;
	}

	name_array = value_to_array(name);

	name_array[0] = value_create_string(func_str, sizeof(func_str) - 1);

	if (name_array[0] == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	name_array[1] = value_create_string(func->name, strlen(func->name));

	if (name_array[1] == NULL)
	{
		value_type_destroy(name);

		return NULL;
	}

	return name;
}